

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

string * __thiscall
glcts::generateBasicVertexSrc_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *__s;
  size_t sVar1;
  string *psVar2;
  stringstream str;
  stringstream asStack_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  __s = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"in highp vec4 a_position;\n",0x1a);
  if (8 < (int)(GLSLVersion)this) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n",0x2a);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"void main (void)\n{\n   gl_Position = a_position;\n}\n",0x32);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return psVar2;
}

Assistant:

static std::string generateBasicVertexSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	str << "in highp vec4 a_position;\n";
	if (glslVersion >= glu::GLSL_VERSION_410)
	{
		str << "out gl_PerVertex {\n"
			   "  vec4 gl_Position;\n"
			   "};\n";
	}
	str << "void main (void)\n"
		   "{\n"
		   "   gl_Position = a_position;\n"
		   "}\n";

	return str.str();
}